

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditions.h
# Opt level: O0

uint32_t __thiscall
absl::lts_20250127::log_internal::LogEveryPow2State::counter(LogEveryPow2State *this)

{
  LogEveryPow2State *this_local;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  return (this->counter_).super___atomic_base<unsigned_int>._M_i;
}

Assistant:

uint32_t counter() { return counter_.load(std::memory_order_relaxed); }